

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_py_struct_reader(t_py_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *ptVar1;
  bool bVar2;
  int32_t iVar3;
  ostream *poVar4;
  t_const_value *ptVar5;
  t_type *type;
  reference pptVar6;
  string *psVar7;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3f0
  ;
  t_field **local_3e8;
  string local_3e0 [32];
  string local_3c0;
  string local_3a0;
  string local_380 [32];
  string local_360;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_270
  ;
  t_field **local_268;
  byte local_259;
  string local_258 [7];
  bool first;
  string local_238;
  undefined1 local_218 [8];
  ostringstream result;
  t_field *tfield;
  t_field **local_90;
  char *local_88;
  char *id;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_py_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  bVar2 = is_immutable(&tstruct->super_t_type);
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
    poVar4 = std::operator<<(out,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,"@classmethod");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&id,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&id);
    poVar4 = std::operator<<(poVar4,"def read(cls, iprot):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"def read(self, iprot):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up(&this->super_t_generator);
  bVar2 = is_immutable(&tstruct->super_t_type);
  local_88 = "self";
  if (bVar2) {
    local_88 = "cls";
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,
                           "if iprot._fast_decode is not None and isinstance(iprot.trans, TTransport.CReadableTransport) and "
                          );
  poVar4 = std::operator<<(poVar4,local_88);
  poVar4 = std::operator<<(poVar4,".thrift_spec is not None:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  bVar2 = is_immutable(&tstruct->super_t_type);
  if (bVar2) {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,
                             "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"return");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_down(&this->super_t_generator);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar2 = is_immutable(&tstruct->super_t_type);
  if (bVar2) {
    local_90 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_30._M_current = local_90;
    while( true ) {
      tfield = (t_field *)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&tfield);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      result._368_8_ = *pptVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      psVar7 = t_field::get_name_abi_cxx11_((t_field *)result._368_8_);
      poVar4 = std::operator<<((ostream *)local_218,(string *)psVar7);
      std::operator<<(poVar4," = ");
      ptVar5 = t_field::get_value((t_field *)result._368_8_);
      if (ptVar5 == (t_const_value *)0x0) {
        std::operator<<((ostream *)local_218,"None");
      }
      else {
        render_field_default_value_abi_cxx11_(&local_238,this,(t_field *)result._368_8_);
        std::operator<<((ostream *)local_218,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
      }
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      std::__cxx11::ostringstream::str();
      poVar4 = std::operator<<(poVar4,local_258);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_30);
    }
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"while True:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"(fname, ftype, fid) = iprot.readFieldBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"if ftype == TType.STOP:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"break");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down(&this->super_t_generator);
  local_259 = 1;
  local_268 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_268;
  while( true ) {
    local_270._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_270);
    if (!bVar2) break;
    if ((local_259 & 1) == 0) {
      t_generator::indent_abi_cxx11_(&local_2b0,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_2b0);
      std::operator<<(poVar4,"elif ");
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    else {
      local_259 = 0;
      t_generator::indent_abi_cxx11_(&local_290,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_290);
      std::operator<<(poVar4,"if ");
      std::__cxx11::string::~string((string *)&local_290);
    }
    poVar4 = std::operator<<(out,"fid == ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    iVar3 = t_field::get_key(*pptVar6);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up(&this->super_t_generator);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"if ftype == ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    type = t_field::get_type(*pptVar6);
    type_to_enum_abi_cxx11_(&local_2d0,this,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_2d0);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
    t_generator::indent_up(&this->super_t_generator);
    bVar2 = is_immutable(&tstruct->super_t_type);
    if (bVar2) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,"",&local_2f1);
      generate_deserialize_field(this,out,ptVar1,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
    else {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,"self.",&local_319);
      generate_deserialize_field(this,out,ptVar1,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_340,&this->super_t_generator);
    poVar4 = std::operator<<(out,(string *)&local_340);
    poVar4 = std::operator<<(poVar4,"else:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_360,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_360);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_380);
    poVar4 = std::operator<<(poVar4,local_380);
    poVar4 = std::operator<<(poVar4,"iprot.skip(ftype)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    t_generator::indent_down(&this->super_t_generator);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_abi_cxx11_(&local_3a0,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_3a0);
  poVar4 = std::operator<<(poVar4,"else:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::operator<<(poVar4,(string *)&local_3c0);
  (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_3e0);
  poVar4 = std::operator<<(poVar4,local_3e0);
  poVar4 = std::operator<<(poVar4,"iprot.skip(ftype)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readFieldEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down(&this->super_t_generator);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar2 = is_immutable(&tstruct->super_t_type);
  if (bVar2) {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"return cls(");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up(&this->super_t_generator);
    local_3e8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_30._M_current = local_3e8;
    while( true ) {
      local_3f0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_3f0);
      if (!bVar2) break;
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4,"=");
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4,",");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_30);
    }
    t_generator::indent_down(&this->super_t_generator);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,")");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_down(&this->super_t_generator);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_py_generator::generate_py_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_immutable(tstruct)) {
    out << indent() << "@classmethod" << endl << indent() << "def read(cls, iprot):" << endl;
  } else {
    indent(out) << "def read(self, iprot):" << endl;
  }
  indent_up();

  const char* id = is_immutable(tstruct) ? "cls" : "self";

  indent(out) << "if iprot._fast_decode is not None "
                 "and isinstance(iprot.trans, TTransport.CReadableTransport) "
                 "and "
              << id << ".thrift_spec is not None:" << endl;
  indent_up();

  if (is_immutable(tstruct)) {
    indent(out) << "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])" << endl;
  } else {
    indent(out) << "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])" << endl;
    indent(out) << "return" << endl;
  }
  indent_down();

  indent(out) << "iprot.readStructBegin()" << endl;
  
  if (is_immutable(tstruct)) {
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* tfield = *f_iter;
      std::ostringstream result;
      result << tfield->get_name() << " = ";
      if (tfield->get_value() != nullptr) {
        result << render_field_default_value(tfield);
      } else {
        result << "None";
      }
      indent(out) << result.str() << endl;
     }
  }

  // Loop over reading in fields
  indent(out) << "while True:" << endl;
  indent_up();

  // Read beginning field marker
  indent(out) << "(fname, ftype, fid) = iprot.readFieldBegin()" << endl;

  // Check for field STOP marker and break
  indent(out) << "if ftype == TType.STOP:" << endl;
  indent_up();
  indent(out) << "break" << endl;
  indent_down();

  // Switch statement on the field we are reading
  bool first = true;

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << indent() << "if ";
    } else {
      out << indent() << "elif ";
    }
    out << "fid == " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << ":" << endl;
    indent_up();
    if (is_immutable(tstruct)) {
      generate_deserialize_field(out, *f_iter);
    } else {
      generate_deserialize_field(out, *f_iter, "self.");
    }
    indent_down();
    out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd()" << endl;

  indent_down();

  indent(out) << "iprot.readStructEnd()" << endl;

  if (is_immutable(tstruct)) {
    indent(out) << "return cls(" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << (*f_iter)->get_name() << "=" << (*f_iter)->get_name() << "," << endl;
    }
    indent_down();
    indent(out) << ")" << endl;
  }

  indent_down();
  out << endl;
}